

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_math.c
# Opt level: O3

int lj_cf_math_randomseed(lua_State *L)

{
  uint uVar1;
  long lVar2;
  PRNGState *rs;
  int iVar3;
  double dVar4;
  double dVar5;
  
  rs = (PRNGState *)
       ((*(ulong *)((L->base[-2].u64 & 0x7fffffffffff) + 0x30) & 0x7fffffffffff) + 0x30);
  dVar5 = lj_lib_checknum(L,1);
  uVar1 = 0x11090601;
  lVar2 = 0;
  do {
    dVar4 = (double)(ulong)(uint)(1 << (sbyte)uVar1);
    uVar1 = uVar1 >> 8;
    dVar5 = dVar5 * 3.141592653589793 + 2.718281828459045;
    if ((ulong)dVar4 <= (ulong)dVar5) {
      dVar4 = 0.0;
    }
    rs->u[lVar2] = (long)dVar4 + (long)dVar5;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  iVar3 = 10;
  do {
    lj_prng_u64(rs);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  return 0;
}

Assistant:

LJLIB_CF(math_randomseed)
{
  PRNGState *rs = (PRNGState *)(uddata(udataV(lj_lib_upvalue(L, 1))));
  random_seed(rs, lj_lib_checknum(L, 1));
  return 0;
}